

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_buffer_pool.cpp
# Opt level: O2

int __thiscall
libtorrent::disk_buffer_pool::allocate_iovec
          (disk_buffer_pool *this,span<libtorrent::span<char>_> iov)

{
  char *pcVar1;
  long lVar2;
  unique_lock<std::mutex> *extraout_RDX;
  unique_lock<std::mutex> *puVar3;
  unique_lock<std::mutex> *extraout_RDX_00;
  unique_lock<std::mutex> *puVar4;
  unique_lock<std::mutex> *extraout_RDX_01;
  span<char> *psVar5;
  long lVar6;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> uStack_38;
  
  puVar4 = (unique_lock<std::mutex> *)&this->m_pool_mutex;
  std::unique_lock<std::mutex>::unique_lock(&uStack_38,(mutex_type *)puVar4);
  lVar6 = iov.m_len << 4;
  puVar3 = extraout_RDX;
  psVar5 = iov.m_ptr;
  do {
    lVar2 = lVar6;
    if (lVar2 == 0) goto LAB_002dae85;
    pcVar1 = allocate_buffer_impl(this,puVar4,(char *)puVar3);
    psVar5->m_ptr = pcVar1;
    psVar5->m_len = 0x4000;
    psVar5 = psVar5 + 1;
    lVar6 = lVar2 + -0x10;
    puVar3 = extraout_RDX_00;
  } while (pcVar1 != (char *)0x0);
  puVar4 = extraout_RDX_00;
  for (lVar6 = 0;
      (iov.m_len << 4 != lVar6 &&
      (pcVar1 = *(char **)((long)&(iov.m_ptr)->m_ptr + lVar6), pcVar1 != (char *)0x0));
      lVar6 = lVar6 + 0x10) {
    free_buffer_impl(this,pcVar1,puVar4);
    puVar4 = extraout_RDX_01;
  }
LAB_002dae85:
  std::unique_lock<std::mutex>::~unique_lock(&uStack_38);
  return -(uint)(lVar2 != 0);
}

Assistant:

int disk_buffer_pool::allocate_iovec(span<iovec_t> iov)
	{
		std::unique_lock<std::mutex> l(m_pool_mutex);
		for (auto& i : iov)
		{
			i = { allocate_buffer_impl(l, "pending read"), std::size_t(default_block_size)};
			if (i.data() == nullptr)
			{
				// uh oh. We failed to allocate the buffer!
				// we need to roll back and free all the buffers
				// we've already allocated
				for (auto j : iov)
				{
					if (j.data() == nullptr) break;
					char* buf = j.data();
					TORRENT_ASSERT(is_disk_buffer(buf, l));
					remove_buffer_in_use(buf);
					free_buffer_impl(buf, l);
				}
				return -1;
			}
		}
		return 0;
	}